

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QDateTime *dt,QWidget *parent)

{
  byte bVar1;
  DateTimePickerPrivate *pDVar2;
  ConnectionType type;
  undefined1 local_a8 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_98;
  code *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_70;
  code *local_68;
  undefined8 local_60;
  undefined1 local_58 [12];
  QTime local_4c;
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  local_48;
  QDateTime local_40 [8];
  QSizePolicy local_38 [5];
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  QDateTime *dt_local;
  DateTimePicker *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)dt;
  dt_local = (QDateTime *)this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_00232578;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_00232728;
  pDVar2 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(pDVar2,this,QDateTime);
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  ::QScopedPointer(&this->d,pDVar2);
  QSizePolicy::QSizePolicy(local_38,Fixed,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy *)this);
  bVar1 = QDateTime::isValid();
  if ((bVar1 & 1) == 0) {
    QDate::QDate((QDate *)&local_48,100,1,1);
    QTime::QTime(&local_4c,0,0,0,0);
    QDateTime::QDateTime
              (local_40,(QDate *)local_48.d,(QTime *)(ulong)(uint)local_4c.mds,LocalTime,0);
  }
  else {
    QDateTime::QDateTime(local_40,(QDateTime *)parent_local);
  }
  setDateTime(this,local_40);
  QDateTime::~QDateTime(local_40);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_68 = Scroller::aboutToStart;
  local_60 = 0;
  local_80._8_8_ = _q_scrollAboutToStart;
  QStack_70.d = (ScrollerPrivate *)0x0;
  type = (ConnectionType)this;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_58,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::aboutToStart,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_90 = Scroller::scroll;
  local_88 = 0;
  local_a8._8_8_ = _q_scroll;
  QStack_98.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)local_80,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::scroll,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_a8,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QDateTime & dt, QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDateTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	setDateTime( dt.isValid() ? dt : DATETIMEPICKER_DATETIME_MIN );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}